

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kliveness.c
# Opt level: O0

int collectSafetyInvariantPOIndex(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pObj_00;
  char *pcVar2;
  int local_24;
  int i;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtk_local;
  
  local_24 = 0;
  while( true ) {
    iVar1 = Abc_NtkPoNum(pNtk);
    if (iVar1 <= local_24) {
      return -1;
    }
    pObj_00 = Abc_NtkPo(pNtk,local_24);
    pcVar2 = Abc_ObjName(pObj_00);
    pcVar2 = strstr(pcVar2,"csSafetyInvar_");
    if (pcVar2 != (char *)0x0) break;
    local_24 = local_24 + 1;
  }
  return local_24;
}

Assistant:

int collectSafetyInvariantPOIndex(Abc_Ntk_t *pNtk)
{
    Abc_Obj_t *pObj;
    int i;

    Abc_NtkForEachPo( pNtk, pObj, i )
    {
        if( strstr( Abc_ObjName( pObj ), "csSafetyInvar_" ) != NULL )
            return i;
    }        

    return -1;
}